

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InliningDecider.cpp
# Opt level: O1

FunctionInfo * __thiscall
InliningDecider::Inline
          (InliningDecider *this,FunctionBody *inliner,FunctionInfo *functionInfo,
          bool isConstructorCall,bool isPolymorphicCall,bool isCallback,uint16 constantArgInfo,
          ProfileId callSiteId,uint recursiveInlineDepth,bool allowRecursiveInlining)

{
  ushort uVar1;
  FunctionBody *pFVar2;
  FunctionBody *pFVar3;
  code *pcVar4;
  wchar wVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  LocalFunctionId LVar9;
  int iVar10;
  uint32 uVar11;
  undefined4 *puVar12;
  undefined4 extraout_var;
  char16 *pcVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  char16 *pcVar16;
  ByteBlock *pBVar17;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  char16_t *form;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_108 [4];
  char16 debugStringBuffer2 [42];
  wchar local_a8 [4];
  char16 debugStringBuffer [42];
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  pFVar2 = (FunctionBody *)(functionInfo->functionBodyImpl).ptr;
  if ((pFVar2 == (FunctionBody *)0x0) ||
     (bVar6 = Js::FunctionProxy::IsFunctionBody((FunctionProxy *)pFVar2), !bVar6)) {
    ValueType::ValueType((ValueType *)&local_108[0].field_0);
    if (functionInfo == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InliningDecider.cpp"
                         ,0x185,"(funcInfo)","funcInfo");
      if (!bVar6) goto LAB_00564279;
      *puVar12 = 0;
    }
    local_a8[0] = L'\0';
    local_108[0].field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         (anon_union_2_4_ea848c7b_for_ValueType_13)0x9;
    if ((functionInfo->functionBodyImpl).ptr == (FunctionProxy *)0x0) {
      GetBuiltInInfoCommon
                (functionInfo->functionId,(OpCode *)local_a8,(ValueType *)&local_108[0].field_0);
    }
    wVar5 = local_a8[0];
    if ((local_a8[0] != L'\0') ||
       (bVar6 = ValueType::IsUninitialized((ValueType *)&local_108[0].field_0), !bVar6)) {
      if (this->jitMode != FullJit) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InliningDecider.cpp"
                           ,0x155,"(this->jitMode == ExecutionMode::FullJit)",
                           "this->jitMode == ExecutionMode::FullJit");
        if (!bVar6) goto LAB_00564279;
        *puVar12 = 0;
      }
      if (wVar5 == L'\0') {
        return functionInfo;
      }
      uVar7 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inliner);
      if ((inliner->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
          (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                           ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar6) goto LAB_00564279;
        *puVar12 = 0;
      }
      bVar6 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_015bbe90,InlinePhase,uVar7,
                         ((inliner->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.
                         ptr)->functionId);
      if (bVar6) {
        return (FunctionInfo *)0x0;
      }
      uVar7 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inliner);
      if ((inliner->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
          (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                           ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar6) goto LAB_00564279;
        *puVar12 = 0;
      }
      bVar6 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_015bbe90,GlobOptPhase,uVar7,
                         ((inliner->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.
                         ptr)->functionId);
      if (!bVar6 && !isConstructorCall) {
        return functionInfo;
      }
    }
    return (FunctionInfo *)0x0;
  }
  if (this->isLoopBody == true) {
    uVar7 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
    pFVar3 = this->topFunc;
    if ((pFVar3->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
        (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      register0x00000000 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *register0x00000000 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar6) goto LAB_00564279;
      *stack0xffffffffffffffb0 = 0;
    }
    bVar6 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015bbe90,InlineInJitLoopBodyPhase,uVar7,
                       ((pFVar3->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)
                       ->functionId);
    if (bVar6) {
      if (DAT_015d346a != '\x01') {
        return (FunctionInfo *)0x0;
      }
      uVar7 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
      pFVar2 = this->topFunc;
      if ((pFVar2->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
          (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                           ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar6) goto LAB_00564279;
        *puVar12 = 0;
      }
      bVar6 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_015d3490,InlinePhase,uVar7,
                         ((pFVar2->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr
                         )->functionId);
      if (!bVar6) {
        return (FunctionInfo *)0x0;
      }
      iVar8 = (*(this->topFunc->super_ParseableFunctionInfo).super_FunctionProxy.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7]
              )();
      pcVar13 = Js::FunctionProxy::GetDebugNumberSet
                          ((FunctionProxy *)this->topFunc,(wchar (*) [42])local_a8);
      Output::Print(L"INLINING: Skip Inline: Jit loop body: %s (%s)\n",CONCAT44(extraout_var,iVar8),
                    pcVar13);
      goto LAB_00563f07;
    }
  }
  bVar6 = Js::FunctionProxy::IsFunctionBody((FunctionProxy *)pFVar2);
  if (!bVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                       ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
    if (!bVar6) goto LAB_00564279;
    *puVar12 = 0;
  }
  if (this->jitMode != FullJit) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InliningDecider.cpp"
                       ,0xfe,"(this->jitMode == ExecutionMode::FullJit)",
                       "this->jitMode == ExecutionMode::FullJit");
    if (!bVar6) goto LAB_00564279;
    *puVar12 = 0;
  }
  uVar7 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar2);
  if ((pFVar2->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
      (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar6) goto LAB_00564279;
    *puVar12 = 0;
  }
  bVar6 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015bbe90,InlinePhase,uVar7,
                     ((pFVar2->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->
                     functionId);
  if (bVar6) {
    return (FunctionInfo *)0x0;
  }
  uVar7 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar2);
  if ((pFVar2->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
      (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar6) {
LAB_00564279:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar12 = 0;
  }
  bVar6 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015bbe90,GlobOptPhase,uVar7,
                     ((pFVar2->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->
                     functionId);
  if (bVar6) {
    return (FunctionInfo *)0x0;
  }
  bVar6 = ContinueInliningUserDefinedFunctions(this,this->bytecodeInlinedCount);
  if (!bVar6) {
    return (FunctionInfo *)0x0;
  }
  if (this->isInDebugMode != false) {
    return (FunctionInfo *)0x0;
  }
  if (((functionInfo->attributes & (DeferredParse|DeferredDeserialize)) == None) &&
     (pBVar17 = Js::FunctionBody::GetByteCode(pFVar2), pBVar17 != (ByteBlock *)0x0)) {
    uVar1 = (pFVar2->super_ParseableFunctionInfo).m_inParamCount;
    if (0xf < uVar1) {
      uVar7 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
      LVar9 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
      bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,InlinePhase,uVar7,LVar9);
      if (!bVar6) {
        return (FunctionInfo *)0x0;
      }
      iVar8 = (*(pFVar2->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(pFVar2);
      pcVar13 = Js::FunctionProxy::GetDebugNumberSet
                          ((FunctionProxy *)pFVar2,(wchar (*) [42])local_a8);
      uVar1 = (pFVar2->super_ParseableFunctionInfo).m_inParamCount;
      iVar10 = (*(inliner->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                 super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(inliner);
      pcVar16 = Js::FunctionProxy::GetDebugNumberSet
                          ((FunctionProxy *)inliner,(wchar (*) [42])local_108);
      Output::Print(L"INLINING: Skip Inline: Params count greater then MaxInlineeArgoutCount\tInlinee: %s (%s)\tParamcount: %d\tMaxInlineeArgoutCount: %d\tCaller: %s (%s)\n"
                    ,CONCAT44(extraout_var_02,iVar8),pcVar13,(ulong)uVar1,0xf,
                    CONCAT44(extraout_var_03,iVar10),pcVar16);
      goto LAB_00563f07;
    }
    if ((uVar1 == 0) &&
       (((pFVar2->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 2) == 0)) {
      uVar7 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
      LVar9 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
      bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,InlinePhase,uVar7,LVar9);
      if (!bVar6) {
        return (FunctionInfo *)0x0;
      }
      iVar8 = (*(pFVar2->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(pFVar2);
      pcVar13 = Js::FunctionProxy::GetDebugNumberSet
                          ((FunctionProxy *)pFVar2,(wchar (*) [42])local_a8);
      uVar1 = (pFVar2->super_ParseableFunctionInfo).m_inParamCount;
      iVar10 = (*(inliner->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                 super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(inliner);
      pcVar16 = Js::FunctionProxy::GetDebugNumberSet
                          ((FunctionProxy *)inliner,(wchar (*) [42])local_108);
      Output::Print(L"INLINING: Skip Inline: Params count is zero!\tInlinee: %s (%s)\tParamcount: %d\tCaller: %s (%s)\n"
                    ,CONCAT44(extraout_var_04,iVar8),pcVar13,(ulong)uVar1,
                    CONCAT44(extraout_var_05,iVar10),pcVar16);
      goto LAB_00563f07;
    }
    if (((pFVar2->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47 & 8) == 0) {
      bVar6 = Js::FunctionProxy::IsClassConstructor((FunctionProxy *)pFVar2);
      if (!bVar6 || isConstructorCall) {
        bVar6 = DeciderInlineIntoInliner
                          (this,pFVar2,inliner,isConstructorCall,isPolymorphicCall,constantArgInfo,
                           recursiveInlineDepth,allowRecursiveInlining);
        if (bVar6) {
          iVar8 = (*(pFVar2->super_ParseableFunctionInfo).super_FunctionProxy.
                    super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[7])(pFVar2);
          pcVar13 = Js::FunctionProxy::GetDebugNumberSet
                              ((FunctionProxy *)pFVar2,(wchar (*) [42])local_a8);
          uVar11 = Js::FunctionBody::GetCountField(pFVar2,ByteCodeCount);
          TraceInlining(inliner,(char16 *)CONCAT44(extraout_var_06,iVar8),pcVar13,uVar11,
                        this->topFunc,this->bytecodeInlinedCount,pFVar2,(uint)callSiteId,
                        this->isLoopBody,isCallback,0xffffffff);
          uVar11 = Js::FunctionBody::GetCountField(pFVar2,ByteCodeCount);
          this->bytecodeInlinedCount = this->bytecodeInlinedCount + uVar11;
          return (pFVar2->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        }
        return (FunctionInfo *)0x0;
      }
      uVar7 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
      LVar9 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
      bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,InlinePhase,uVar7,LVar9);
      if (!bVar6) {
        return (FunctionInfo *)0x0;
      }
      iVar8 = (*(pFVar2->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(pFVar2);
      uVar14 = CONCAT44(extraout_var_09,iVar8);
      pcVar13 = Js::FunctionProxy::GetDebugNumberSet
                          ((FunctionProxy *)pFVar2,(wchar (*) [42])local_a8);
      iVar8 = (*(inliner->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(inliner);
      uVar15 = CONCAT44(extraout_var_10,iVar8);
      pcVar16 = Js::FunctionProxy::GetDebugNumberSet
                          ((FunctionProxy *)inliner,(wchar (*) [42])local_108);
      form = 
      L"INLINING: Skip Inline: Class constructor without new keyword\tInlinee: %s (%s)\tCaller: %s (%s)\n"
      ;
    }
    else {
      uVar7 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
      LVar9 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
      bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,InlinePhase,uVar7,LVar9);
      if (!bVar6) {
        return (FunctionInfo *)0x0;
      }
      iVar8 = (*(pFVar2->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(pFVar2);
      uVar14 = CONCAT44(extraout_var_07,iVar8);
      pcVar13 = Js::FunctionProxy::GetDebugNumberSet
                          ((FunctionProxy *)pFVar2,(wchar (*) [42])local_a8);
      iVar8 = (*(inliner->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(inliner);
      uVar15 = CONCAT44(extraout_var_08,iVar8);
      pcVar16 = Js::FunctionProxy::GetDebugNumberSet
                          ((FunctionProxy *)inliner,(wchar (*) [42])local_108);
      form = L"INLINING: Skip Inline: Do not inline\tInlinee: %s (%s)\tCaller: %s (%s)\n";
    }
  }
  else {
    uVar7 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
    LVar9 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
    bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,InlinePhase,uVar7,LVar9);
    if (!bVar6) {
      return (FunctionInfo *)0x0;
    }
    iVar8 = (*(pFVar2->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(pFVar2);
    uVar14 = CONCAT44(extraout_var_00,iVar8);
    pcVar13 = Js::FunctionProxy::GetDebugNumberSet((FunctionProxy *)pFVar2,(wchar (*) [42])local_a8)
    ;
    iVar8 = (*(inliner->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(inliner);
    uVar15 = CONCAT44(extraout_var_01,iVar8);
    pcVar16 = Js::FunctionProxy::GetDebugNumberSet
                        ((FunctionProxy *)inliner,(wchar (*) [42])local_108);
    form = L"INLINING: Skip Inline: No bytecode\tInlinee: %s (%s)\tCaller: %s (%s)\n";
  }
  Output::Print(form,uVar14,pcVar13,uVar15,pcVar16);
LAB_00563f07:
  Output::Flush();
  return (FunctionInfo *)0x0;
}

Assistant:

Js::FunctionInfo *InliningDecider::Inline(Js::FunctionBody *const inliner, 
    Js::FunctionInfo* functionInfo,
    bool isConstructorCall, 
    bool isPolymorphicCall, 
    bool isCallback, 
    uint16 constantArgInfo, 
    Js::ProfileId callSiteId, 
    uint recursiveInlineDepth, 
    bool allowRecursiveInlining)
{
#if defined(DBG_DUMP) || defined(ENABLE_DEBUG_CONFIG_OPTIONS)
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    char16 debugStringBuffer2[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
    Js::FunctionProxy * proxy = functionInfo->GetFunctionProxy();
    if (proxy && proxy->IsFunctionBody())
    {
        if (isLoopBody && PHASE_OFF(Js::InlineInJitLoopBodyPhase, this->topFunc))
        {
            INLINE_TESTTRACE_VERBOSE(_u("INLINING: Skip Inline: Jit loop body: %s (%s)\n"), this->topFunc->GetDisplayName(),
                this->topFunc->GetDebugNumberSet(debugStringBuffer));
            return nullptr;
        }

        // Note: disable inline for debugger, as we can't bailout at return from function.
        // Alternative can be generate this bailout as part of inline, which can be done later as perf improvement.
        const auto inlinee = proxy->GetFunctionBody();
        Assert(this->jitMode == ExecutionMode::FullJit);
        if (PHASE_OFF(Js::InlinePhase, inlinee) ||
            PHASE_OFF(Js::GlobOptPhase, inlinee) ||
            !ContinueInliningUserDefinedFunctions(this->bytecodeInlinedCount) ||
            this->isInDebugMode)
        {
            return nullptr;
        }

        if (functionInfo->IsDeferred() || inlinee->GetByteCode() == nullptr)
        {
            // DeferredParse...
            INLINE_TESTTRACE(_u("INLINING: Skip Inline: No bytecode\tInlinee: %s (%s)\tCaller: %s (%s)\n"),
                inlinee->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer), inliner->GetDisplayName(),
                inliner->GetDebugNumberSet(debugStringBuffer2));
            return nullptr;
        }

#ifdef _M_IX86
        if (inlinee->GetHasTry())
        {
            INLINE_TESTTRACE(_u("INLINING: Skip Inline: Has try\tInlinee: %s (%s)\tCaller: %s (%s)\n"),
            inlinee->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer), inliner->GetDisplayName(),
            inliner->GetDebugNumberSet(debugStringBuffer2));
            return nullptr;
        }
#endif

        // This is a hard limit as the argOuts array is statically sized.
        if (inlinee->GetInParamsCount() > Js::InlineeCallInfo::MaxInlineeArgoutCount)
        {
            INLINE_TESTTRACE(_u("INLINING: Skip Inline: Params count greater then MaxInlineeArgoutCount\tInlinee: %s (%s)\tParamcount: %d\tMaxInlineeArgoutCount: %d\tCaller: %s (%s)\n"),
                inlinee->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer), inlinee->GetInParamsCount(), Js::InlineeCallInfo::MaxInlineeArgoutCount,
                inliner->GetDisplayName(), inliner->GetDebugNumberSet(debugStringBuffer2));
            return nullptr;
        }

        // Wasm functions can have no params
        if (inlinee->GetInParamsCount() == 0 && !inlinee->GetIsAsmjsMode())
        {
            // Inline candidate has no params, not even a this pointer.  This can only be the global function,
            // which we shouldn't inline.
            INLINE_TESTTRACE(_u("INLINING: Skip Inline: Params count is zero!\tInlinee: %s (%s)\tParamcount: %d\tCaller: %s (%s)\n"),
                inlinee->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer), inlinee->GetInParamsCount(),
                inliner->GetDisplayName(), inliner->GetDebugNumberSet(debugStringBuffer2));
            return nullptr;
        }

        if (inlinee->GetDontInline())
        {
            INLINE_TESTTRACE(_u("INLINING: Skip Inline: Do not inline\tInlinee: %s (%s)\tCaller: %s (%s)\n"),
                inlinee->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer), inliner->GetDisplayName(),
                inliner->GetDebugNumberSet(debugStringBuffer2));
            return nullptr;
        }

        // Do not inline a call to a class constructor if it isn't part of a new expression since the call will throw a TypeError anyway.
        if (inlinee->IsClassConstructor() && !isConstructorCall)
        {
            INLINE_TESTTRACE(_u("INLINING: Skip Inline: Class constructor without new keyword\tInlinee: %s (%s)\tCaller: %s (%s)\n"),
                inlinee->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer), inliner->GetDisplayName(),
                inliner->GetDebugNumberSet(debugStringBuffer2));
            return nullptr;
        }

        if (!DeciderInlineIntoInliner(inlinee, inliner, isConstructorCall, isPolymorphicCall, constantArgInfo, recursiveInlineDepth, allowRecursiveInlining))
        {
            return nullptr;
        }

#if defined(ENABLE_DEBUG_CONFIG_OPTIONS)
        TraceInlining(inliner, inlinee->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer), inlinee->GetByteCodeCount(), this->topFunc, this->bytecodeInlinedCount, inlinee, callSiteId, this->isLoopBody, isCallback);
#endif

        this->bytecodeInlinedCount += inlinee->GetByteCodeCount();
        return inlinee->GetFunctionInfo();
    }

    Js::OpCode builtInInlineCandidateOpCode;
    ValueType builtInReturnType;
    GetBuiltInInfo(functionInfo, &builtInInlineCandidateOpCode, &builtInReturnType);

    if(builtInInlineCandidateOpCode == 0 && builtInReturnType.IsUninitialized())
    {
        return nullptr;
    }

    Assert(this->jitMode == ExecutionMode::FullJit);
    if (builtInInlineCandidateOpCode != 0 &&
        (
            PHASE_OFF(Js::InlinePhase, inliner) ||
            PHASE_OFF(Js::GlobOptPhase, inliner) ||
            isConstructorCall
        ))
    {
        return nullptr;
    }

    // Note: for built-ins at this time we don't have enough data (the instr) to decide whether it's going to be inlined.
    return functionInfo;
}